

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWSImporter::SetupNodeName(LWSImporter *this,aiNode *nd,NodeDesc *src)

{
  anon_enum_32 aVar1;
  long lVar2;
  undefined8 uVar3;
  undefined1 *__s;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  undefined8 local_38;
  size_type t;
  size_type s;
  NodeDesc *pNStack_20;
  uint combined;
  NodeDesc *src_local;
  aiNode *nd_local;
  LWSImporter *this_local;
  
  s._4_4_ = src->number | src->type << 0x1c;
  pNStack_20 = src;
  src_local = (NodeDesc *)nd;
  nd_local = (aiNode *)this;
  if ((src->type == OBJECT) && (lVar2 = std::__cxx11::string::length(), lVar2 != 0)) {
    lVar2 = std::__cxx11::string::find_last_of((char *)&pNStack_20->path,0xb6285b);
    if (lVar2 == -1) {
      t = 0;
    }
    else {
      t = lVar2 + 1;
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)&pNStack_20->path);
    uVar3 = std::__cxx11::string::find_last_of((char *)local_58,0xb6a312);
    std::__cxx11::string::~string(local_58);
    __s = &src_local->field_0x4;
    local_38 = uVar3;
    std::__cxx11::string::substr((ulong)local_98,(ulong)&pNStack_20->path);
    std::__cxx11::string::substr((ulong)local_78,(ulong)local_98);
    uVar3 = std::__cxx11::string::c_str();
    aVar1 = snprintf(__s,0x400,"%s_(%08X)",uVar3,(ulong)s._4_4_);
    src_local->type = aVar1;
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
  }
  else {
    aVar1 = snprintf(&src_local->field_0x4,0x400,"%s_(%08X)",pNStack_20->name,(ulong)s._4_4_);
    src_local->type = aVar1;
  }
  return;
}

Assistant:

void LWSImporter::SetupNodeName(aiNode* nd, LWS::NodeDesc& src)
{
    const unsigned int combined = src.number | ((unsigned int)src.type) << 28u;

    // the name depends on the type. We break LWS's strange naming convention
    // and return human-readable, but still machine-parsable and unique, strings.
    if (src.type == LWS::NodeDesc::OBJECT)  {

        if (src.path.length()) {
            std::string::size_type s = src.path.find_last_of("\\/");
            if (s == std::string::npos)
                s = 0;
            else ++s;
            std::string::size_type t = src.path.substr(s).find_last_of(".");

            nd->mName.length = ::ai_snprintf(nd->mName.data, MAXLEN, "%s_(%08X)",src.path.substr(s).substr(0,t).c_str(),combined);
            return;
        }
    }
    nd->mName.length = ::ai_snprintf(nd->mName.data, MAXLEN, "%s_(%08X)",src.name,combined);
}